

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_node_list_around
          (REF_CELL ref_cell,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  ulong uVar4;
  REF_INT RVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  *nnode = 0;
  RVar5 = -1;
  uVar4 = 0xffffffff;
  if (-1 < node) {
    uVar4 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar4 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar4 != -1) {
    RVar5 = ref_cell->ref_adj->item[(int)uVar4].ref;
  }
  do {
    if ((int)uVar4 == -1) {
      return 0;
    }
    if (0 < ref_cell->node_per) {
      pRVar2 = ref_cell->c2n;
      iVar6 = 0;
      do {
        iVar1 = pRVar2[ref_cell->size_per * RVar5 + iVar6];
        if (iVar1 != node) {
          lVar7 = (long)*nnode;
          if (0 < lVar7) {
            lVar8 = 0;
            do {
              if (node_list[lVar8] == iVar1) goto LAB_0011ae81;
              lVar8 = lVar8 + 1;
            } while (lVar7 != lVar8);
          }
          if (max_node <= *nnode) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x4e8,"ref_cell_node_list_around",7,"max_node too small");
            return 7;
          }
          node_list[lVar7] = iVar1;
          *nnode = *nnode + 1;
        }
LAB_0011ae81:
        iVar6 = iVar6 + 1;
      } while (iVar6 < ref_cell->node_per);
    }
    pRVar3 = ref_cell->ref_adj->item;
    uVar4 = (ulong)pRVar3[(int)uVar4].next;
    if (uVar4 == 0xffffffffffffffff) {
      RVar5 = -1;
    }
    else {
      RVar5 = pRVar3[uVar4].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_node_list_around(REF_CELL ref_cell, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
      already_have_it = REF_FALSE;
      for (haves = 0; haves < *nnode; haves++)
        if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
          already_have_it = REF_TRUE;
          break;
        }
      if (!already_have_it) {
        if (*nnode >= max_node) {
          RSS(REF_INCREASE_LIMIT, "max_node too small");
        }
        node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
        (*nnode)++;
      }
    }
  }

  return REF_SUCCESS;
}